

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_get_available_union_field_index(coda_cursor *cursor,long *index)

{
  int iVar1;
  coda_type *local_380;
  char local_378 [8];
  char s2 [21];
  char local_358 [8];
  char s1 [21];
  int64_t index64;
  coda_cursor union_cursor;
  coda_type_record *record;
  long *index_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_380 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_380 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  union_cursor.stack[0x1f].bit_offset = (int64_t)local_380;
  if (local_380[1].attributes == (coda_type_record *)0x0) {
    coda_set_error(-0x69,"cursor does not refer to a union");
    cursor_local._4_4_ = -1;
  }
  else {
    if ((long)local_380[1].name < 1) {
      __assert_fail("record->num_fields > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x379,
                    "int coda_ascbin_cursor_get_available_union_field_index(const coda_cursor *, long *)"
                   );
    }
    memcpy(&index64,cursor,0x310);
    union_cursor.stack[(long)(int)union_cursor.product + -1].bit_offset =
         *(int64_t *)(**(long **)(union_cursor.stack[0x1f].bit_offset + 0x50) + 0x10);
    union_cursor.stack[(int)union_cursor.product].type =
         (coda_dynamic_type_struct *)0xffffffffffffffff;
    union_cursor.stack[(int)union_cursor.product].index =
         union_cursor.stack[(int)union_cursor.product + -1].index;
    union_cursor.product._0_4_ = (int)union_cursor.product + 1;
    iVar1 = coda_expression_eval_integer
                      (*(coda_expression **)(union_cursor.stack[0x1f].bit_offset + 0x68),
                       (coda_cursor *)&index64,(int64_t *)(s1 + 0x10));
    if (iVar1 == 0) {
      if ((stack0xfffffffffffffcc0 < 0) ||
         (*(long *)(union_cursor.stack[0x1f].bit_offset + 0x48) <= stack0xfffffffffffffcc0)) {
        coda_str64(stack0xfffffffffffffcc0,local_358);
        coda_str64(cursor->stack[cursor->n + -1].bit_offset >> 3,local_378);
        coda_set_error(-300,
                       "possible product error detected (invalid result (%s) from union field expression - num fields = %ld - byte:bit offset = %s:%d)"
                       ,local_358,*(undefined8 *)(union_cursor.stack[0x1f].bit_offset + 0x48),
                       local_378,(ulong)((uint)cursor->stack[cursor->n + -1].bit_offset & 7));
        coda_cursor_add_to_error_message(cursor);
        cursor_local._4_4_ = -1;
      }
      else {
        *index = stack0xfffffffffffffcc0;
        cursor_local._4_4_ = 0;
      }
    }
    else {
      coda_add_error_message(" for union field expression");
      coda_cursor_add_to_error_message(cursor);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascbin_cursor_get_available_union_field_index(const coda_cursor *cursor, long *index)
{
    coda_type_record *record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_cursor union_cursor;
    int64_t index64;

    if (record->union_field_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a union");
        return -1;
    }
    assert(record->num_fields > 0);

    /* find field using the type of the first union field to evaluate the expression */
    union_cursor = *cursor;
    union_cursor.n++;
    union_cursor.stack[union_cursor.n - 1].type = (coda_dynamic_type *)record->field[0]->type;
    union_cursor.stack[union_cursor.n - 1].index = -1;
    union_cursor.stack[union_cursor.n - 1].bit_offset = union_cursor.stack[union_cursor.n - 2].bit_offset;
    if (coda_expression_eval_integer(record->union_field_expr, &union_cursor, &index64) != 0)
    {
        coda_add_error_message(" for union field expression");
        coda_cursor_add_to_error_message(cursor);
        return -1;
    }
    if (index64 < 0 || index64 >= record->num_fields)
    {
        char s1[21];
        char s2[21];

        coda_str64(index64, s1);
        coda_str64((cursor->stack[cursor->n - 1].bit_offset >> 3), s2);
        coda_set_error(CODA_ERROR_PRODUCT,
                       "possible product error detected (invalid result (%s) from union field expression - "
                       "num fields = %ld - byte:bit offset = %s:%d)", s1, record->num_fields, s2,
                       (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
        coda_cursor_add_to_error_message(cursor);
        return -1;
    }
    *index = (long)index64;

    return 0;
}